

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O0

size_t __thiscall remote::Handle::GetModuleAddress(Handle *this,string *name)

{
  bool bVar1;
  int iVar2;
  reference pRVar3;
  undefined1 local_c8 [8];
  Region reg;
  iterator __end2;
  iterator __begin2;
  vector<remote::Region,_std::allocator<remote::Region>_> *__range2;
  vector<remote::Region,_std::allocator<remote::Region>_> regions;
  string *name_local;
  Handle *this_local;
  
  regions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)name;
  bVar1 = IsRunning(this);
  if (bVar1) {
    GetRegions((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range2,this);
    __end2 = std::vector<remote::Region,_std::allocator<remote::Region>_>::begin
                       ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range2);
    reg.filename.field_2._8_8_ =
         std::vector<remote::Region,_std::allocator<remote::Region>_>::end
                   ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
                                       *)((long)&reg.filename.field_2 + 8)), bVar1) {
      pRVar3 = __gnu_cxx::
               __normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
               ::operator*(&__end2);
      Region::Region((Region *)local_c8,pRVar3);
      iVar2 = std::__cxx11::string::compare((string *)(reg.pathname.field_2._M_local_buf + 8));
      bVar1 = iVar2 == 0;
      if (bVar1) {
        this_local = (Handle *)local_c8;
      }
      Region::~Region((Region *)local_c8);
      if (bVar1) goto LAB_0010a5df;
      __gnu_cxx::
      __normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
      ::operator++(&__end2);
    }
    bVar1 = false;
LAB_0010a5df:
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector
              ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range2);
    if (bVar1) {
      return (size_t)this_local;
    }
  }
  return 0;
}

Assistant:

size_t Handle::GetModuleAddress(string name) {
    if(IsRunning()) {
        vector<Region> regions = GetRegions();

        // These are ordered by memory start in maps
        // So first result is fine
        for(auto reg : regions) {
            if(reg.filename.compare(name) == 0) {
                return reg.start;
            }
        }
    }

    return 0;
}